

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cte.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalCTE::BuildPipelines(PhysicalCTE *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  bool bVar1;
  PipelineBuildState *pPVar2;
  MetaPipeline *this_00;
  reference this_01;
  PhysicalOperator *pPVar3;
  MetaPipeline *in_RDX;
  undefined8 in_RSI;
  reference_wrapper<const_duckdb::PhysicalOperator> *cte_scan;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *__range1;
  MetaPipeline *child_meta_pipeline;
  PipelineBuildState *state;
  Pipeline *in_stack_ffffffffffffff68;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *in_stack_ffffffffffffff70;
  PhysicalOperator *in_stack_ffffffffffffff78;
  pair<const_duckdb::PhysicalOperator_&,_duckdb::Pipeline_&> *__x;
  undefined8 in_stack_ffffffffffffffb8;
  MetaPipelineType type;
  PhysicalOperator *in_stack_ffffffffffffffc0;
  __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
  in_stack_ffffffffffffffc8;
  MetaPipeline *in_stack_ffffffffffffffd0;
  
  type = (MetaPipelineType)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>::
  reset((unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
         *)in_stack_ffffffffffffff70,(pointer)in_stack_ffffffffffffff68);
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::reset
            ((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)in_stack_ffffffffffffff70,(pointer)in_stack_ffffffffffffff68);
  pPVar2 = MetaPipeline::GetState(in_RDX);
  this_00 = MetaPipeline::CreateChildMetaPipeline
                      (in_stack_ffffffffffffffd0,(Pipeline *)in_stack_ffffffffffffffc8._M_current,
                       in_stack_ffffffffffffffc0,type);
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
            (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  ::std::reference_wrapper::operator_cast_to_PhysicalOperator_
            ((reference_wrapper<duckdb::PhysicalOperator> *)0x18c5a72);
  MetaPipeline::Build(this_00,in_stack_ffffffffffffff78);
  std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::begin((vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
           *)in_stack_ffffffffffffff68);
  std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::end((vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
         *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 =
         (vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
         __gnu_cxx::
         __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
         ::operator*((__normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
                      *)&stack0xffffffffffffffc8);
    __x = (pair<const_duckdb::PhysicalOperator_&,_duckdb::Pipeline_&> *)&pPVar2->cte_dependencies;
    MetaPipeline::GetBasePipeline((MetaPipeline *)0x18c5af6);
    shared_ptr<duckdb::Pipeline,_true>::operator*
              ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_ffffffffffffff70);
    ::std::reference_wrapper<duckdb::Pipeline>::
    reference_wrapper<duckdb::Pipeline&,void,duckdb::Pipeline*>
              ((reference_wrapper<duckdb::Pipeline> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    ::std::
    make_pair<std::reference_wrapper<duckdb::PhysicalOperator_const>&,std::reference_wrapper<duckdb::Pipeline>>
              ((reference_wrapper<const_duckdb::PhysicalOperator> *)in_stack_ffffffffffffff70,
               (reference_wrapper<duckdb::Pipeline> *)in_stack_ffffffffffffff68);
    ::std::
    unordered_map<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::reference_wrapper<duckdb::Pipeline>,duckdb::ReferenceHashFunction<duckdb::PhysicalOperator_const>,duckdb::ReferenceEquality<duckdb::PhysicalOperator_const>,std::allocator<std::pair<std::reference_wrapper<duckdb::PhysicalOperator_const>const,std::reference_wrapper<duckdb::Pipeline>>>>
    ::insert<std::pair<duckdb::PhysicalOperator_const&,duckdb::Pipeline&>>
              ((unordered_map<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>_>
                *)this_00,__x);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
    ::operator++((__normal_iterator<std::reference_wrapper<const_duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  this_01 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                      (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  pPVar3 = ::std::reference_wrapper<duckdb::PhysicalOperator>::get(this_01);
  (*pPVar3->_vptr_PhysicalOperator[0x26])(pPVar3,in_RSI,in_RDX);
  return;
}

Assistant:

void PhysicalCTE::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	D_ASSERT(children.size() == 2);
	op_state.reset();
	sink_state.reset();

	auto &state = meta_pipeline.GetState();

	auto &child_meta_pipeline = meta_pipeline.CreateChildMetaPipeline(current, *this);
	child_meta_pipeline.Build(children[0]);

	for (auto &cte_scan : cte_scans) {
		state.cte_dependencies.insert(make_pair(cte_scan, reference<Pipeline>(*child_meta_pipeline.GetBasePipeline())));
	}

	children[1].get().BuildPipelines(current, meta_pipeline);
}